

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::throw_statement::print(throw_statement *this,wostream *os)

{
  bool bVar1;
  syntax_node *sn;
  wostream *os_local;
  throw_statement *this_local;
  
  std::operator<<(os,"throw_statement{");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->e_);
  if (bVar1) {
    sn = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                    (&this->e_)->super_syntax_node;
    mjs::operator<<(os,sn);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "throw_statement{";
        if (e_) os << *e_;
        os << "}";
    }